

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.cc
# Opt level: O1

void re2::RandomTest(int maxatoms,int maxops,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *alphabet,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *ops,int maxstrlen,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *stralphabet,string *wrapper)

{
  ExhaustiveTester t;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [46];
  
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
  ExhaustiveTester::ExhaustiveTester
            (&t,maxatoms + -1,maxops + -1,alphabet,ops,(uint)maxstrlen >> 1,stralphabet,wrapper,
             (string *)local_1b0);
  if ((undefined1 **)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_);
  }
  t.randomstrings_ = true;
  t.stringseed_ = FLAGS_stringseed;
  t.stringcount_ = FLAGS_stringcount;
  RegexpGenerator::GenerateRandom(&t.super_RegexpGenerator,FLAGS_regexpseed,FLAGS_regexpcount);
  printf("%d regexps, %d tests, %d failures [%d/%d str]\n",(ulong)(uint)t.regexps_,
         (ulong)(uint)t.tests_,(ulong)(uint)t.failures_,(uint)maxstrlen >> 1,
         (ulong)((long)(stralphabet->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(stralphabet->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (t.failures_ != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/random_test.cc"
               ,0x28,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Check failed: (0) == (t.failures())",0x23);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  t.super_RegexpGenerator._vptr_RegexpGenerator = (_func_int **)&PTR__ExhaustiveTester_00157208;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)t.topwrapper_._M_dataplus._M_p != &t.topwrapper_.field_2) {
    operator_delete(t.topwrapper_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)t.wrapper_._M_dataplus._M_p != &t.wrapper_.field_2) {
    operator_delete(t.wrapper_._M_dataplus._M_p);
  }
  StringGenerator::~StringGenerator(&t.strgen_);
  t.super_RegexpGenerator._vptr_RegexpGenerator = (_func_int **)&PTR__RegexpGenerator_001571d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&t.super_RegexpGenerator.ops_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&t.super_RegexpGenerator.atoms_);
  return;
}

Assistant:

static void RandomTest(int maxatoms, int maxops,
                       const vector<string>& alphabet,
                       const vector<string>& ops,
                       int maxstrlen, const vector<string>& stralphabet,
                       const string& wrapper) {
  // Limit to smaller test cases in debug mode,
  // because everything is so much slower.
  if (RE2_DEBUG_MODE) {
    maxatoms--;
    maxops--;
    maxstrlen /= 2;
  }

  ExhaustiveTester t(maxatoms, maxops, alphabet, ops,
                     maxstrlen, stralphabet, wrapper, "");
  t.RandomStrings(FLAGS_stringseed, FLAGS_stringcount);
  t.GenerateRandom(FLAGS_regexpseed, FLAGS_regexpcount);
  printf("%d regexps, %d tests, %d failures [%d/%d str]\n",
         t.regexps(), t.tests(), t.failures(), maxstrlen, (int)stralphabet.size());
  EXPECT_EQ(0, t.failures());
}